

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O0

JavascriptString * __thiscall Js::CompoundString::Builder<256U>::ToString(Builder<256U> *this)

{
  code *pcVar1;
  bool bVar2;
  CharCount CVar3;
  undefined4 *puVar4;
  JavascriptLibrary *pJVar5;
  CharStringCache *this_00;
  char16 *pcVar6;
  CompoundString *compoundString;
  Builder<256U> *this_local;
  
  this->isFinalized = true;
  this_local = (Builder<256U> *)this->compoundString;
  if (this_local == (Builder<256U> *)0x0) {
    if (this->stringLength == 0) {
      pJVar5 = GetLibrary(this);
      this_local = (Builder<256U> *)JavascriptLibrary::GetEmptyString(pJVar5);
    }
    else if (this->stringLength == 1) {
      bVar2 = HasOnlyDirectChars(this);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                    ,0x343,"(HasOnlyDirectChars())","HasOnlyDirectChars()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      CVar3 = LastBlockCharLength(this);
      if (CVar3 != 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                    ,0x344,"(LastBlockCharLength() == 1)",
                                    "LastBlockCharLength() == 1");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pJVar5 = GetLibrary(this);
      this_00 = JavascriptLibrary::GetCharStringCache(pJVar5);
      pcVar6 = LastBlockChars(this);
      this_local = (Builder<256U> *)CharStringCache::GetStringForChar(this_00,*pcVar6);
    }
    else {
      this_local = (Builder<256U> *)CreateCompoundString(this,false);
    }
  }
  return (JavascriptString *)this_local;
}

Assistant:

inline JavascriptString *CompoundString::Builder<MinimumCharCapacity>::ToString()
    {
    #if DBG
        // Should not append to the builder after this function is called
        isFinalized = true;
    #endif

        CompoundString *const compoundString = this->compoundString;
        if(compoundString)
            return compoundString;

        switch(stringLength)
        {
            default:
                return CreateCompoundString(false);

            case 0:
                return this->GetLibrary()->GetEmptyString();

            case 1:
                Assert(HasOnlyDirectChars());
                Assert(LastBlockCharLength() == 1);

                return this->GetLibrary()->GetCharStringCache().GetStringForChar(LastBlockChars()[0]);
        }
    }